

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

uint rf_compile_shader(char *shader_str,int type)

{
  uint uVar1;
  int length;
  int max_len;
  int success;
  char *local_478;
  char *pcStack_470;
  undefined8 local_468;
  char *local_460;
  char *pcStack_458;
  undefined8 local_450;
  char *local_448;
  char *pcStack_440;
  undefined8 local_438;
  char *shader_str_local;
  char log [1024];
  
  shader_str_local = shader_str;
  uVar1 = (*(rf__ctx->field_0).gfx_ctx.gl.CreateShader)(type);
  (*(rf__ctx->field_0).gfx_ctx.gl.ShaderSource)(uVar1,1,&shader_str_local,(int *)0x0);
  success = 0;
  (*(rf__ctx->field_0).gfx_ctx.gl.CompileShader)(uVar1);
  (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderiv)(uVar1,0x8b81,&success);
  if (success == 1) {
    local_478 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_470 = "rf_compile_shader";
    local_468 = 0x97fa;
    rf_log_impl(2,0x175edf,(char *)(ulong)uVar1);
  }
  else {
    local_448 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_440 = "rf_compile_shader";
    local_438 = 0x97ee;
    rf_log_impl(4,0x175eb6,(char *)(ulong)uVar1);
    max_len = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderiv)(uVar1,0x8b84,&max_len);
    (*(rf__ctx->field_0).gfx_ctx.gl.GetShaderInfoLog)(uVar1,0x400,&length,log);
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_458 = "rf_compile_shader";
    local_450 = 0x97f8;
    rf_log_impl(2,0x1739ab,log);
  }
  return uVar1;
}

Assistant:

RF_INTERNAL unsigned int rf_compile_shader(const char* shader_str, int type)
{
    unsigned int shader = rf_gl.CreateShader(type);
    rf_gl.ShaderSource(shader, 1, &shader_str, NULL);

    int success = 0;
    rf_gl.CompileShader(shader);
    rf_gl.GetShaderiv(shader, GL_COMPILE_STATUS, &success);

    if (success != GL_TRUE)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "[SHDR ID %i] Failed to compile shader...", shader);
        int max_len = 0;
        int length;
        rf_gl.GetShaderiv(shader, GL_INFO_LOG_LENGTH, &max_len);

        //@Note: Buffer may not be big enough for some messages
        char log[1024];

        rf_gl.GetShaderInfoLog(shader, 1024, &length, log);

        RF_LOG(RF_LOG_TYPE_INFO, "%s", log);
    }
    else RF_LOG(RF_LOG_TYPE_INFO, "[SHDR ID %i] rf_shader compiled successfully", shader);

    return shader;
}